

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquerymgr.cc
# Opt level: O0

int __thiscall bdQueryManager::QuerySummary(bdQueryManager *this,bdNodeId *id,bdQuerySummary *query)

{
  bdQuery *pbVar1;
  bool bVar2;
  int iVar3;
  reference ppbVar4;
  _Self local_40;
  _List_node_base *local_38;
  _List_iterator<bdQuery_*> local_30;
  iterator it;
  bdQuerySummary *query_local;
  bdNodeId *id_local;
  bdQueryManager *this_local;
  
  it._M_node = (_List_node_base *)query;
  std::_List_iterator<bdQuery_*>::_List_iterator(&local_30);
  local_38 = (_List_node_base *)
             std::__cxx11::list<bdQuery_*,_std::allocator<bdQuery_*>_>::begin(&this->mLocalQueries);
  local_30._M_node = local_38;
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<bdQuery_*,_std::allocator<bdQuery_*>_>::end(&this->mLocalQueries);
    bVar2 = std::operator!=(&local_30,&local_40);
    if (!bVar2) {
      return 0;
    }
    ppbVar4 = std::_List_iterator<bdQuery_*>::operator*(&local_30);
    iVar3 = ::operator==(&(*ppbVar4)->mId,id);
    if (iVar3 != 0) break;
    std::_List_iterator<bdQuery_*>::operator++(&local_30,0);
  }
  ppbVar4 = std::_List_iterator<bdQuery_*>::operator*(&local_30);
  pbVar1 = *ppbVar4;
  (it._M_node)->_M_next = *(_List_node_base **)(pbVar1->mId).data;
  (it._M_node)->_M_prev = *(_List_node_base **)((pbVar1->mId).data + 8);
  *(undefined4 *)&it._M_node[1]._M_next = *(undefined4 *)((pbVar1->mId).data + 0x10);
  ppbVar4 = std::_List_iterator<bdQuery_*>::operator*(&local_30);
  pbVar1 = *ppbVar4;
  *(undefined8 *)((long)&it._M_node[1]._M_next + 4) =
       *(undefined8 *)(pbVar1->mLimit).super_bdNodeId.data;
  *(undefined8 *)((long)&it._M_node[1]._M_prev + 4) =
       *(undefined8 *)((pbVar1->mLimit).super_bdNodeId.data + 8);
  *(undefined4 *)((long)&it._M_node[2]._M_next + 4) =
       *(undefined4 *)((pbVar1->mLimit).super_bdNodeId.data + 0x10);
  ppbVar4 = std::_List_iterator<bdQuery_*>::operator*(&local_30);
  *(uint32_t *)&it._M_node[2]._M_prev = (*ppbVar4)->mState;
  ppbVar4 = std::_List_iterator<bdQuery_*>::operator*(&local_30);
  it._M_node[3]._M_next = (_List_node_base *)(*ppbVar4)->mQueryTS;
  ppbVar4 = std::_List_iterator<bdQuery_*>::operator*(&local_30);
  *(uint32_t *)&it._M_node[3]._M_prev = (*ppbVar4)->mQueryFlags;
  ppbVar4 = std::_List_iterator<bdQuery_*>::operator*(&local_30);
  *(int32_t *)((long)&it._M_node[3]._M_prev + 4) = (*ppbVar4)->mSearchTime;
  ppbVar4 = std::_List_iterator<bdQuery_*>::operator*(&local_30);
  std::
  multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
  ::operator=((multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
               *)&it._M_node[4]._M_prev,&(*ppbVar4)->mClosest);
  ppbVar4 = std::_List_iterator<bdQuery_*>::operator*(&local_30);
  std::
  multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
  ::operator=((multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
               *)&it._M_node[7]._M_prev,&(*ppbVar4)->mPotentialPeers);
  ppbVar4 = std::_List_iterator<bdQuery_*>::operator*(&local_30);
  std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::operator=
            ((list<bdPeer,_std::allocator<bdPeer>_> *)&it._M_node[10]._M_prev,
             &(*ppbVar4)->mProxiesUnknown);
  ppbVar4 = std::_List_iterator<bdQuery_*>::operator*(&local_30);
  std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::operator=
            ((list<bdPeer,_std::allocator<bdPeer>_> *)(it._M_node + 0xc),
             &(*ppbVar4)->mProxiesFlagged);
  ppbVar4 = std::_List_iterator<bdQuery_*>::operator*(&local_30);
  *(int32_t *)&it._M_node[4]._M_next = (*ppbVar4)->mQueryIdlePeerRetryPeriod;
  return 1;
}

Assistant:

int bdQueryManager::QuerySummary(const bdNodeId *id, bdQuerySummary &query) {
	std::list<bdQuery *>::iterator it;
	for (it = mLocalQueries.begin(); it != mLocalQueries.end(); it++) {
		if ((*it)->mId == *id) {
			query.mId = (*it)->mId;
			query.mLimit = (*it)->mLimit;
			query.mState = (*it)->mState;
			query.mQueryTS = (*it)->mQueryTS;
			query.mQueryFlags = (*it)->mQueryFlags;
			query.mSearchTime = (*it)->mSearchTime;
			query.mClosest = (*it)->mClosest;
			query.mPotentialPeers = (*it)->mPotentialPeers;
			query.mProxiesUnknown = (*it)->mProxiesUnknown;
			query.mProxiesFlagged = (*it)->mProxiesFlagged;
 			query.mQueryIdlePeerRetryPeriod = (*it)->mQueryIdlePeerRetryPeriod;

			return 1;
		}
	}
	return 0;
}